

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O2

void write_crl(scep *s)

{
  int iVar1;
  X509_CRL *x;
  char *fmt;
  FILE *fp;
  
  x = (X509_CRL *)OPENSSL_sk_value(((s->reply_p7->d).sign)->crl,0);
  if (x == (X509_CRL *)0x0) {
    fmt = "cannot find CRL in reply";
    iVar1 = 0x1e;
  }
  else {
    iVar1 = fopen_s(&fp,w_char,"w");
    if (iVar1 == 0) {
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
              ,0x27,"writing CRL");
      if (d_flag != 0) {
        PEM_write_X509_CRL(_stdout,x);
      }
      iVar1 = PEM_write_X509_CRL((FILE *)fp,x);
      if (iVar1 == 1) {
        log_log(2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
                ,0x2e,"CRL written as %s",w_char);
        fclose((FILE *)fp);
        return;
      }
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
              ,0x2a,"error while writing CRL file");
      ERR_print_errors_fp(_stderr);
      goto LAB_00108b4c;
    }
    fmt = "cannot open CRL file for writing";
    iVar1 = 0x24;
  }
  log_log(4,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/fileutils.c"
          ,iVar1,fmt);
LAB_00108b4c:
  exit(0x5d);
}

Assistant:

void write_crl(struct scep *s) {
    PKCS7               *p7;
    STACK_OF(X509_CRL)  *crls;
    X509_CRL            *crl;
    FILE                *fp;

    // Get CRL
    p7 = s->reply_p7;
    crls = p7->d.sign->crl;

    // We expect only one CRL:
    crl = sk_X509_CRL_value(crls, 0);
    if (crl == NULL) {
        log_error("cannot find CRL in reply");
        exit (SCEP_PKISTATUS_FILE);
    }

    // Write PEM-formatted file:
    if (fopen_s(&fp, w_char, "w")) {
        log_error("cannot open CRL file for writing");
        exit (SCEP_PKISTATUS_FILE);
    }
    log_debug("writing CRL");
    if (d_flag) PEM_write_X509_CRL(stdout, crl);
    if (PEM_write_X509_CRL(fp, crl) != 1) {
        log_error("error while writing CRL file");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_FILE);
    }
    log_info("CRL written as %s", w_char);
    fclose(fp);
}